

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteTailCallAsserts(CWriter *this,FuncSignature *sig)

{
  pointer args;
  Type TVar1;
  Newline *in_RAX;
  pointer pTVar2;
  char (*in_RCX) [6];
  vector<wabt::Type,_std::allocator<wabt::Type>_> *in_RDX;
  Type *pTVar3;
  Type *u;
  uint *in_R8;
  char (*in_R9) [3];
  bool bVar4;
  Newline *in_stack_00000008;
  
  if ((sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[22],std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],unsigned_int_const&,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [22])sig,in_RDX,in_RCX,in_R8,in_R9,in_RAX);
  }
  pTVar2 = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  args = (sig->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
  if (args == pTVar2) {
    return;
  }
  u = (sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start;
  if ((long)args - (long)pTVar2 ==
      (long)(sig->param_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)u) {
    bVar4 = pTVar2 == args;
    if (bVar4) {
LAB_0015169a:
      if (bVar4) {
        return;
      }
    }
    else if (*pTVar2 == *u) {
      pTVar3 = u + 1;
      do {
        pTVar2 = pTVar2 + 1;
        bVar4 = pTVar2 == args;
        u = pTVar3;
        if (bVar4) goto LAB_0015169a;
        u = pTVar3 + 1;
        TVar1 = *pTVar3;
        pTVar3 = u;
      } while (*pTVar2 == TVar1);
    }
  }
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[22],std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],unsigned_int_const&,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [22])&sig->result_types,
             (vector<wabt::Type,_std::allocator<wabt::Type>_> *)u,(char (*) [6])args,in_R8,in_R9,
             in_stack_00000008);
  return;
}

Assistant:

void CWriter::WriteTailCallAsserts(const FuncSignature& sig) {
  if (sig.param_types.size()) {
    Write("static_assert(sizeof(", sig.param_types, ") <= ", kTailCallStackSize,
          ");", Newline());
  }
  if (sig.result_types.size() && sig.result_types != sig.param_types) {
    Write("static_assert(sizeof(", sig.result_types,
          ") <= ", kTailCallStackSize, ");", Newline());
  }
}